

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::DefParamSymbol_const*>::
emplaceRealloc<slang::ast::DefParamSymbol_const*>
          (SmallVectorBase<slang::ast::DefParamSymbol_const*> *this,pointer pos,
          DefParamSymbol **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppDVar3;
  DefParamSymbol **__result;
  DefParamSymbol **ppDVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  DefParamSymbol **args_local;
  pointer pos_local;
  SmallVectorBase<const_slang::ast::DefParamSymbol_*> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<const_slang::ast::DefParamSymbol_*>::max_size
                    ((SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<const_slang::ast::DefParamSymbol_*>::calculateGrowth
                       ((SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)this,
                        *(long *)(this + 8) + 1);
  ppDVar3 = SmallVectorBase<const_slang::ast::DefParamSymbol_*>::begin
                      ((SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)this);
  __result = (DefParamSymbol **)slang::detail::allocArray(capacity,8);
  ppDVar4 = __result + ((long)pos - (long)ppDVar3 >> 3);
  *ppDVar4 = *args;
  ppDVar3 = SmallVectorBase<const_slang::ast::DefParamSymbol_*>::end
                      ((SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)this);
  if (pos == ppDVar3) {
    ppDVar3 = SmallVectorBase<const_slang::ast::DefParamSymbol_*>::begin
                        ((SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)this);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<const_slang::ast::DefParamSymbol_*>::end
                    ((SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)this);
    std::uninitialized_move<slang::ast::DefParamSymbol_const**,slang::ast::DefParamSymbol_const**>
              (ppDVar3,(DefParamSymbol **)ctx,__result);
  }
  else {
    ppDVar3 = SmallVectorBase<const_slang::ast::DefParamSymbol_*>::begin
                        ((SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)this);
    std::uninitialized_move<slang::ast::DefParamSymbol_const**,slang::ast::DefParamSymbol_const**>
              (ppDVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<const_slang::ast::DefParamSymbol_*>::end
                    ((SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)this);
    std::uninitialized_move<slang::ast::DefParamSymbol_const**,slang::ast::DefParamSymbol_const**>
              (pos,(DefParamSymbol **)ctx,ppDVar4 + 1);
  }
  SmallVectorBase<const_slang::ast::DefParamSymbol_*>::cleanup
            ((SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(DefParamSymbol ***)this = __result;
  return ppDVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}